

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O2

void __thiscall
glslang::TVarGatherTraverser::visitSymbol(TVarGatherTraverser *this,TIntermSymbol *base)

{
  bool bVar1;
  EShLanguage EVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  *this_00;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  iterator iVar5;
  undefined4 extraout_var_03;
  mapped_type *pmVar6;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long lVar7;
  byte bVar8;
  
  iVar3 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(base);
  lVar7 = 0xd0;
  if ((*(uint *)(CONCAT44(extraout_var,iVar3) + 8) & 0x7f) != 3) {
    iVar3 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(base);
    lVar7 = 0xd8;
    if ((*(uint *)(CONCAT44(extraout_var_00,iVar3) + 8) & 0x7f) != 4) {
      iVar3 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(base);
      if (((*(uint *)(CONCAT44(extraout_var_04,iVar3) + 8) & 0x7f) - 5 < 2) &&
         (iVar3 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(base),
         *(char *)(CONCAT44(extraout_var_05,iVar3) + 0x2d) == '\0')) {
        iVar3 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(base);
        lVar7 = 0xe0;
        if (*(char *)(CONCAT44(extraout_var_06,iVar3) + 0x38) != '\x01') goto LAB_003766a5;
      }
      iVar3 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(base);
      if ((*(uint *)(CONCAT44(extraout_var_07,iVar3) + 8) & 0x7f) != 1) {
        return;
      }
      iVar3 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(base);
      TLiveTraverser::addGlobalReference
                (&this->super_TLiveTraverser,(TString *)CONCAT44(extraout_var_08,iVar3));
      return;
    }
  }
LAB_003766a5:
  this_00 = *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
              **)((long)&(this->super_TLiveTraverser).super_TIntermTraverser._vptr_TIntermTraverser
                 + lVar7);
  if (this_00 !=
      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
       *)0x0) {
    iVar3 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(base);
    bVar1 = (this->super_TLiveTraverser).traverseAll;
    EVar2 = ((this->super_TLiveTraverser).intermediate)->language;
    iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(base);
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
            ::find(this_00,(key_type *)CONCAT44(extraout_var_02,iVar4));
    if (((_Rb_tree_header *)iVar5._M_node == &(this_00->_M_impl).super__Rb_tree_header) ||
       (iVar5._M_node[2]._M_parent != (_Base_ptr)CONCAT44(extraout_var_01,iVar3))) {
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(base);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                             *)this_00,(key_type *)CONCAT44(extraout_var_03,iVar4));
      pmVar6->id = (longlong)CONCAT44(extraout_var_01,iVar3);
      pmVar6->symbol = base;
      pmVar6->live = (bool)(bVar1 ^ 1);
      pmVar6->upgradedToPushConstantPacking = ElpNone;
      pmVar6->newBinding = 0;
      pmVar6->newSet = 0;
      pmVar6->newLocation = 0;
      pmVar6->newComponent = 0;
      pmVar6->newIndex = 0;
      pmVar6->stage = EVar2;
    }
    else {
      bVar8 = 1;
      if (*(char *)&iVar5._M_node[2]._M_right == '\0') {
        bVar8 = (this->super_TLiveTraverser).traverseAll ^ 1;
      }
      *(byte *)&iVar5._M_node[2]._M_right = bVar8;
    }
  }
  return;
}

Assistant:

virtual void visitSymbol(TIntermSymbol* base)
    {
        TVarLiveMap* target = nullptr;
        if (base->getQualifier().storage == EvqVaryingIn)
            target = &inputList;
        else if (base->getQualifier().storage == EvqVaryingOut)
            target = &outputList;
        else if (base->getQualifier().isUniformOrBuffer() && !base->getQualifier().isPushConstant() && !base->getQualifier().isShaderRecord())
            target = &uniformList;
        // If a global is being visited, then we should also traverse it incase it's evaluation
        // ends up visiting inputs we want to tag as live
        else if (base->getQualifier().storage == EvqGlobal)
            addGlobalReference(base->getAccessName());

        if (target) {
            TVarEntryInfo ent = {base->getId(), base, ! traverseAll, {}, {}, {}, {}, {}, {}, {}};
            ent.stage = intermediate.getStage();
            TVarLiveMap::iterator at = target->find(
                ent.symbol->getAccessName()); // std::lower_bound(target->begin(), target->end(), ent, TVarEntryInfo::TOrderById());
            if (at != target->end() && at->second.id == ent.id)
                at->second.live = at->second.live || ! traverseAll; // update live state
            else
                (*target)[ent.symbol->getAccessName()] = ent;
        }
    }